

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QCalendarBackend::dateTimeToString
          (QString *__return_storage_ptr__,QCalendarBackend *this,QStringView format,
          QDateTime *datetime,QDate dateOnly,QTime timeOnly,QLocale *locale)

{
  QChar fillChar;
  QLocaleData *pQVar1;
  bool bVar2;
  Data *pDVar3;
  qsizetype qVar4;
  QString *pQVar5;
  char16_t *pcVar6;
  Data *pDVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  CutResult CVar12;
  int iVar13;
  char32_t cVar14;
  int iVar15;
  time_t tVar16;
  uint extraout_var;
  storage_type_conflict *psVar17;
  storage_type_conflict *psVar18;
  int extraout_EDX;
  long originalLength;
  int repeat;
  QCalendarBackend *__timer;
  QLocale QVar19;
  QArrayData *pQVar20;
  QArrayData *pQVar21;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView str;
  QStringView needle;
  QStringView haystack;
  QDateTime when;
  qsizetype i_1;
  qsizetype i;
  anon_class_8_1_5fb9ff98 tzAbbr;
  undefined8 local_110;
  ulong local_f8;
  Data local_c0;
  QString local_b8;
  QArrayData *local_a0;
  anon_class_16_2_4001139c local_98;
  QString local_88;
  QTime local_64;
  QLocale local_60;
  QString local_58;
  long local_38;
  
  psVar18 = format.m_data;
  originalLength = format.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_64.mds = -1;
  __timer = this;
  bVar8 = QDateTime::isValid(datetime);
  if (bVar8) {
    dateOnly = QDateTime::date(datetime);
    tVar16 = QDateTime::time(datetime,(time_t *)__timer);
    local_64.mds = (int)tVar16;
    bVar8 = true;
    bVar2 = false;
  }
  else {
    bVar2 = true;
    bVar8 = true;
    if (0x16d3e147973 < dateOnly.jd + 0xb69eeff91fU) {
      bVar8 = QTime::isValid(&timeOnly);
      if (!bVar8) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        goto LAB_00317105;
      }
      local_64.mds = timeOnly.mds;
      dateOnly.jd = -0x8000000000000000;
      bVar2 = false;
      bVar8 = false;
    }
  }
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  iVar11 = 0;
  local_f8 = 0;
  local_110 = 0;
  if (bVar8) {
    iVar11 = (*this->_vptr_QCalendarBackend[0x11])(this,dateOnly.jd);
    local_110 = CONCAT44(extraout_var,iVar11);
    local_f8 = (ulong)extraout_var;
    iVar11 = extraout_EDX;
    if (local_f8 != 0x80000000) goto LAB_00316492;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
LAB_00316492:
    local_98.locale = locale;
    local_98.result = &local_88;
    local_a0 = (QArrayData *)0x0;
    if (0 < originalLength) {
      do {
        fillChar.ucs = psVar18[(long)local_a0];
        if (fillChar.ucs == L'\'') {
          qt_readEscapedFormatString(&local_58,format,(qsizetype *)&local_a0);
          QString::append(&local_88,&local_58);
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          local_b8.d.d = (Data *)0xffffffffffffffff;
          local_58.d.d = (Data *)local_a0;
          CVar12 = QtPrivate::QContainerImplHelper::mid
                             (originalLength,(qsizetype *)&local_58,(qsizetype *)&local_b8);
          pQVar5 = local_98.result;
          psVar17 = (storage_type_conflict *)0x0;
          if (CVar12 != Null) {
            psVar17 = psVar18 + (long)local_58.d.d;
          }
          pQVar21 = (QArrayData *)0x0;
          if ((&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0 && CVar12 != Null) &&
             (pQVar21 = (QArrayData *)0x1, 1 < (long)local_b8.d.d)) {
            pQVar20 = (QArrayData *)0x1;
            do {
              pQVar21 = pQVar20;
              if (psVar17[(long)pQVar20] != *psVar17) break;
              pQVar20 = (QArrayData *)
                        ((long)&(pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + 1);
              pQVar21 = &(local_b8.d.d)->super_QArrayData;
            } while (&(local_b8.d.d)->super_QArrayData != pQVar20);
          }
          iVar13 = (int)pQVar21;
          if (bVar8) {
            if (fillChar.ucs == L'M') {
              repeat = 4;
              if (iVar13 < 4) {
                repeat = iVar13;
              }
              if (iVar13 < 3) {
                bVar10 = true;
                dateTimeToString::anon_class_16_2_4001139c::operator()
                          (&local_98,(int)local_f8,repeat);
              }
              else {
                (*this->_vptr_QCalendarBackend[0x14])
                          (&local_58,this,locale,local_f8,local_110,(ulong)(iVar13 == 3));
                QString::append(&local_88,&local_58);
joined_r0x00316790:
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                  }
                }
                bVar10 = true;
              }
            }
            else if (fillChar.ucs == L'd') {
              repeat = 4;
              if (iVar13 < 4) {
                repeat = iVar13;
              }
              if (2 < iVar13) {
                iVar15 = (*this->_vptr_QCalendarBackend[0x12])(this,dateOnly.jd);
                QCalendar::QCalendar((QCalendar *)&local_b8);
                QCalendar::weekDayName
                          (&local_58,(QCalendar *)&local_b8,locale,iVar15,(uint)(iVar13 == 3));
                QString::append(&local_88,&local_58);
                goto joined_r0x00316790;
              }
              bVar10 = true;
              dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar11,repeat);
            }
            else {
              if (fillChar.ucs != L'y') goto LAB_00316678;
              repeat = 2;
              if (iVar13 < 2) {
                repeat = iVar13;
              }
              if (3 < iVar13) {
                repeat = 4;
              }
              if (repeat == 2) {
                QLocaleData::longLongToString
                          (&local_58,(((local_98.locale)->d).d.ptr)->m_data,
                           (long)((int)(uint)local_110 % 100),-1,10,2,2);
                QString::append(pQVar5,&local_58);
                goto joined_r0x00316790;
              }
              if (repeat == 4) {
                bVar10 = true;
                dateTimeToString::anon_class_16_2_4001139c::operator()
                          (&local_98,(uint)local_110,(uint)local_110 >> 0x1f | 4);
              }
              else {
                QString::append(&local_88,(QChar)0x79);
                bVar10 = true;
                repeat = 1;
              }
            }
          }
          else {
LAB_00316678:
            bVar10 = false;
            repeat = iVar13;
          }
          if (bVar2 || bVar10) goto LAB_00317045;
          if ((ushort)fillChar.ucs < 0x6d) {
            if ((ushort)fillChar.ucs < 0x61) {
              if (fillChar.ucs == L'A') {
LAB_00316b7b:
                local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                iVar13 = QTime::hour(&local_64);
                if (iVar13 < 0xc) {
                  QLocale::amText(&local_58,locale);
                }
                else {
                  QLocale::pmText(&local_58,locale);
                }
                pQVar21 = local_a0;
                local_b8.d.d = (Data *)((long)&(local_a0->ref_)._q_value.super___atomic_base<int>.
                                               _M_i + 1);
                local_60.d.d.ptr =
                     (QSharedDataPointer<QLocalePrivate>)
                     (totally_ordered_wrapper<QLocalePrivate_*>)0xffffffffffffffff;
                CVar12 = QtPrivate::QContainerImplHelper::mid
                                   (originalLength,(qsizetype *)&local_b8,(qsizetype *)&local_60);
                if (CVar12 == Null) {
                  QVar19.d.d.ptr =
                       (QSharedDataPointer<QLocalePrivate>)
                       (totally_ordered_wrapper<QLocalePrivate_*>)0x0;
                  psVar17 = (storage_type_conflict *)0x0;
                }
                else {
                  psVar17 = psVar18 + (long)local_b8.d.d;
                  QVar19.d.d.ptr = local_60.d.d.ptr;
                }
                local_b8.d.d = (Data *)CONCAT62(local_b8.d.d._2_6_,0x70);
                needle.m_data = (storage_type_conflict *)&local_b8;
                needle.m_size = 1;
                haystack.m_data = psVar17;
                haystack.m_size = (qsizetype)QVar19.d.d.ptr;
                bVar10 = QtPrivate::startsWith(haystack,needle,CaseInsensitive);
                if ((fillChar.ucs != L'A') ||
                   ((bVar10 &&
                    (psVar18[(long)((long)&(pQVar21->ref_)._q_value.super___atomic_base<int>._M_i +
                                   1)] != L'P')))) {
                  if ((fillChar.ucs == L'a') &&
                     ((!bVar10 ||
                      (psVar18[(long)((long)&(pQVar21->ref_)._q_value.super___atomic_base<int>._M_i
                                     + 1)] == L'p')))) {
                    QString::toLower_helper(&local_b8,&local_58);
                    goto LAB_00316d30;
                  }
                }
                else {
                  QString::toUpper_helper(&local_b8,&local_58);
LAB_00316d30:
                  pcVar6 = local_58.d.ptr;
                  pDVar7 = local_58.d.d;
                  qVar4 = local_b8.d.size;
                  pDVar3 = local_b8.d.d;
                  local_b8.d.d = local_58.d.d;
                  local_58.d.d = pDVar3;
                  local_58.d.ptr = local_b8.d.ptr;
                  local_b8.d.ptr = pcVar6;
                  local_b8.d.size = local_58.d.size;
                  local_58.d.size = qVar4;
                  if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
                    ;
                    UNLOCK();
                    if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                    {
                      QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                    }
                  }
                }
                QString::append(&local_88,&local_58);
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                  }
                }
                iVar13 = bVar10 + 1;
LAB_00317022:
                bVar10 = true;
                repeat = iVar13;
              }
              else if (fillChar.ucs == L'H') {
                iVar13 = QTime::hour(&local_64);
                if (1 < repeat) {
                  repeat = 2;
                }
                bVar10 = true;
                dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar13,repeat);
              }
            }
            else {
              if (fillChar.ucs == L'a') goto LAB_00316b7b;
              if (fillChar.ucs == L'h') {
                if (1 < repeat) {
                  repeat = 2;
                }
                iVar13 = QTime::hour(&local_64);
                local_b8.d.d = (Data *)0x0;
                bVar10 = true;
                do {
                  pDVar3 = local_b8.d.d;
                  if ((uint)(ushort)psVar18[(long)local_b8.d.d] == L'\'') {
                    qt_readEscapedFormatString(&local_58,format,(qsizetype *)&local_b8);
                    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_58.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  else {
                    cVar14 = QChar::toLower((uint)(ushort)psVar18[(long)local_b8.d.d]);
                    if ((short)cVar14 == 0x61) break;
                    local_b8.d.d = (Data *)((long)&(pDVar3->super_QArrayData).ref_._q_value.
                                                   super___atomic_base<int>._M_i + 1);
                  }
                  bVar10 = (long)local_b8.d.d < originalLength;
                } while ((long)local_b8.d.d < originalLength);
                if (bVar10) {
                  if (iVar13 < 0xd) {
                    if (iVar13 == 0) {
                      iVar13 = 0xc;
                    }
                  }
                  else {
                    iVar13 = iVar13 + -0xc;
                  }
                }
                bVar10 = true;
                dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar13,repeat);
              }
            }
          }
          else if ((ushort)fillChar.ucs < 0x74) {
            if (fillChar.ucs == L'm') {
              iVar13 = QTime::minute(&local_64);
              if (1 < repeat) {
                repeat = 2;
              }
              bVar10 = true;
              dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar13,repeat);
            }
            else if (fillChar.ucs == L's') {
              iVar13 = QTime::second(&local_64);
              if (1 < repeat) {
                repeat = 2;
              }
              bVar10 = true;
              dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar13,repeat);
            }
          }
          else {
            if (fillChar.ucs == L't') {
              local_60.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
              QLocale::QLocale(&local_60,locale);
              iVar13 = 4;
              if (repeat < 4) {
                iVar13 = repeat;
              }
              local_c0.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
              if (bVar8) {
                QDateTime::QDateTime((QDateTime *)&local_c0.data,datetime);
              }
              else {
                QDateTime::currentDateTime();
              }
              local_58.d.d = (Data *)0x0;
              local_58.d.ptr = (char16_t *)0x0;
              local_58.d.size = 0;
              if (iVar13 - 2U < 2) {
                dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                          (&local_b8,(anon_class_8_1_5fb9ff98 *)&local_60,
                           (QDateTime *)&local_c0.data,Offset);
                pcVar6 = local_58.d.ptr;
                pDVar7 = local_58.d.d;
                qVar4 = local_b8.d.size;
                pDVar3 = local_b8.d.d;
                local_b8.d.d = local_58.d.d;
                local_58.d.d = pDVar3;
                local_58.d.ptr = local_b8.d.ptr;
                local_b8.d.ptr = pcVar6;
                local_b8.d.size = local_58.d.size;
                local_58.d.size = qVar4;
                if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                  }
                }
                if (repeat == 2) {
                  QString::remove(&local_58,(char *)0x3a);
                }
              }
              else if (iVar13 == 4) {
                dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                          (&local_b8,(anon_class_8_1_5fb9ff98 *)&local_60,
                           (QDateTime *)&local_c0.data,Long);
                pcVar6 = local_58.d.ptr;
                pDVar7 = local_58.d.d;
                qVar4 = local_b8.d.size;
                pDVar3 = local_b8.d.d;
                local_b8.d.d = local_58.d.d;
                local_58.d.d = pDVar3;
                local_58.d.ptr = local_b8.d.ptr;
                local_b8.d.ptr = pcVar6;
                local_b8.d.size = local_58.d.size;
                local_58.d.size = qVar4;
                if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                  }
                }
              }
              else {
                dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                          (&local_b8,(anon_class_8_1_5fb9ff98 *)&local_60,
                           (QDateTime *)&local_c0.data,Short);
                pcVar6 = local_58.d.ptr;
                pDVar7 = local_58.d.d;
                qVar4 = local_b8.d.size;
                pDVar3 = local_b8.d.d;
                local_b8.d.d = local_58.d.d;
                local_58.d.d = pDVar3;
                local_58.d.ptr = local_b8.d.ptr;
                local_b8.d.ptr = pcVar6;
                local_b8.d.size = local_58.d.size;
                local_58.d.size = qVar4;
                if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                  }
                }
                s.m_data = "UTC";
                s.m_size = 3;
                bVar10 = QString::startsWith(&local_58,s,CaseSensitive);
                if ((bVar10) && ((undefined1 *)local_58.d.size == (undefined1 *)0x6)) {
                  str.m_data = ":00";
                  str.m_size = 3;
                  QString::append(&local_58,str);
                }
              }
              if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
                QString::append(&local_88,&local_58);
              }
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              QDateTime::~QDateTime((QDateTime *)&local_c0.data);
              QLocale::~QLocale(&local_60);
              goto LAB_00317022;
            }
            if (fillChar.ucs == L'z') {
              iVar13 = 3;
              if (repeat < 3) {
                iVar13 = repeat;
              }
              iVar15 = QTime::msec(&local_64);
              pQVar5 = local_98.result;
              QLocaleData::longLongToString
                        (&local_58,(((local_98.locale)->d).d.ptr)->m_data,(long)iVar15,-1,10,3,2);
              QString::append(pQVar5,&local_58);
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              bVar10 = true;
              bVar9 = repeat < 3;
              repeat = iVar13;
              if (bVar9) {
                pQVar1 = ((locale->d).d.ptr)->m_data;
                localeString(&local_58,pQVar1,ZeroDigit,
                             (DataRange)
                             ((ulong)pQVar1->m_zero_size << 0x20 | (ulong)pQVar1->m_zero_idx));
                bVar9 = QString::endsWith(&local_88,&local_58,CaseSensitive);
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (bVar9) {
                  QString::chop(&local_88,1);
                }
                pQVar1 = ((locale->d).d.ptr)->m_data;
                localeString(&local_58,pQVar1,ZeroDigit,
                             (DataRange)
                             ((ulong)pQVar1->m_zero_size << 0x20 | (ulong)pQVar1->m_zero_idx));
                bVar9 = QString::endsWith(&local_88,&local_58,CaseSensitive);
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (bVar9) {
                  QString::chop(&local_88,1);
                }
              }
            }
          }
LAB_00317045:
          if (!bVar10) {
            QString::resize(&local_88,local_88.d.size + repeat,fillChar);
          }
          local_a0 = (QArrayData *)
                     ((long)&(local_a0->ref_)._q_value.super___atomic_base<int>._M_i + (long)repeat)
          ;
        }
      } while ((long)local_a0 < originalLength);
    }
    qVar4 = local_88.d.size;
    pcVar6 = local_88.d.ptr;
    pDVar3 = local_88.d.d;
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = pcVar6;
    local_88.d.size = 0;
    (__return_storage_ptr__->d).size = qVar4;
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00317105:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCalendarBackend::dateTimeToString(QStringView format, const QDateTime &datetime,
                                           QDate dateOnly, QTime timeOnly,
                                           const QLocale &locale) const
{
    QDate date;
    QTime time;
    bool formatDate = false;
    bool formatTime = false;
    if (datetime.isValid()) {
        date = datetime.date();
        time = datetime.time();
        formatDate = true;
        formatTime = true;
    } else if (dateOnly.isValid()) {
        date = dateOnly;
        formatDate = true;
    } else if (timeOnly.isValid()) {
        time = timeOnly;
        formatTime = true;
    } else {
        return QString();
    }

    QString result;
    int year = 0, month = 0, day = 0;
    if (formatDate) {
        const auto parts = julianDayToDate(date.toJulianDay());
        if (!parts.isValid())
            return QString();
        year = parts.year;
        month = parts.month;
        day = parts.day;
    }

    auto appendToResult = [&](int t, int repeat) {
        auto data = locale.d->m_data;
        if (repeat > 1)
            result.append(data->longLongToString(t, -1, 10, repeat, QLocaleData::ZeroPadded));
        else
            result.append(data->longLongToString(t));
    };

    auto formatType = [](int repeat) {
        return repeat == 3 ? QLocale::ShortFormat : QLocale::LongFormat;
    };

    qsizetype i = 0;
    while (i < format.size()) {
        if (format.at(i).unicode() == '\'') {
            result.append(qt_readEscapedFormatString(format, &i));
            continue;
        }

        const QChar c = format.at(i);
        qsizetype rep = qt_repeatCount(format.mid(i));
        Q_ASSERT(rep < std::numeric_limits<int>::max());
        int repeat = int(rep);
        bool used = false;
        if (formatDate) {
            switch (c.unicode()) {
            case 'y':
                used = true;
                if (repeat >= 4)
                    repeat = 4;
                else if (repeat >= 2)
                    repeat = 2;

                switch (repeat) {
                case 4:
                    appendToResult(year, (year < 0) ? 5 : 4);
                    break;
                case 2:
                    appendToResult(year % 100, 2);
                    break;
                default:
                    repeat = 1;
                    result.append(c);
                    break;
                }
                break;

            case 'M':
                used = true;
                repeat = qMin(repeat, 4);
                if (repeat <= 2)
                    appendToResult(month, repeat);
                else
                    result.append(monthName(locale, month, year, formatType(repeat)));
                break;

            case 'd':
                used = true;
                repeat = qMin(repeat, 4);
                if (repeat <= 2)
                    appendToResult(day, repeat);
                else
                    result.append(
                            locale.dayName(dayOfWeek(date.toJulianDay()), formatType(repeat)));
                break;

            default:
                break;
            }
        }
        if (!used && formatTime) {
            switch (c.unicode()) {
            case 'h': {
                used = true;
                repeat = qMin(repeat, 2);
                int hour = time.hour();
                if (timeFormatContainsAP(format)) {
                    if (hour > 12)
                        hour -= 12;
                    else if (hour == 0)
                        hour = 12;
                }
                appendToResult(hour, repeat);
                break;
            }
            case 'H':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.hour(), repeat);
                break;

            case 'm':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.minute(), repeat);
                break;

            case 's':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.second(), repeat);
                break;

            case 'A':
            case 'a': {
                QString text = time.hour() < 12 ? locale.amText() : locale.pmText();
                used = true;
                repeat = 1;
                if (format.mid(i + 1).startsWith(u'p', Qt::CaseInsensitive))
                    ++repeat;
                if (c.unicode() == 'A' && (repeat == 1 || format.at(i + 1).unicode() == 'P'))
                    text = std::move(text).toUpper();
                else if (c.unicode() == 'a' && (repeat == 1 || format.at(i + 1).unicode() == 'p'))
                    text = std::move(text).toLower();
                // else 'Ap' or 'aP' => use CLDR text verbatim, preserving case
                result.append(text);
                break;
            }

            case 'z':
                used = true;
                repeat = qMin(repeat, 3);

                // note: the millisecond component is treated like the decimal part of the seconds
                // so ms == 2 is always printed as "002", but ms == 200 can be either "2" or "200"
                appendToResult(time.msec(), 3);
                if (repeat != 3) {
                    if (result.endsWith(locale.zeroDigit()))
                        result.chop(1);
                    if (result.endsWith(locale.zeroDigit()))
                        result.chop(1);
                }
                break;

            case 't': {
                enum AbbrType { Long, Offset, Short };
                const auto tzAbbr = [locale](const QDateTime &when, AbbrType type) {
                    QString text;
                    if (type == Offset) {
                        text = QtTimeZoneLocale::zoneOffsetFormat(locale, locale.d->m_index,
                                                                  QLocale::ShortFormat,
                                                                  when, when.offsetFromUtc());
                        // When using timezone_locale data, this should always succeed:
                        if (!text.isEmpty())
                            return text;
                    }
#if QT_CONFIG(timezone)
                    if (type != Short || locale != QLocale::system()) {
                        QTimeZone::NameType mode =
                            type == Short ? QTimeZone::ShortName
                            : type == Long ? QTimeZone::LongName : QTimeZone::OffsetName;
                        text = when.timeRepresentation().displayName(when, mode, locale);
                        if (!text.isEmpty())
                            return text;
                        // else fall back to an unlocalized one if we can manage it:
                    } // else: prefer QDateTime's abbreviation, for backwards-compatibility.
#endif // else, make do with non-localized abbreviation:
                    // Absent timezone_locale data, Offset might still reach here:
                    if (type == Offset) // Our prior failure might not have tried this:
                        text = when.toOffsetFromUtc(when.offsetFromUtc()).timeZoneAbbreviation();
                    if (text.isEmpty()) // Notably including type != Offset
                        text = when.timeZoneAbbreviation();
                    return type == Offset ? offsetFromAbbreviation(std::move(text)) : text;
                };

                used = true;
                repeat = qMin(repeat, 4);
                // If we don't have a date-time, use the current system time:
                const QDateTime when = formatDate ? datetime : QDateTime::currentDateTime();
                QString text;
                switch (repeat) {
                case 4:
                    text = tzAbbr(when, Long);
                    break;
                case 3: // ±hh:mm
                case 2: // ±hhmm (we'll remove the ':' at the end)
                    text = tzAbbr(when, Offset);
                    if (repeat == 2)
                        text.remove(u':');
                    break;
                default:
                    text = tzAbbr(when, Short);
                    // UTC-offset zones only include minutes if non-zero.
                    if (text.startsWith("UTC"_L1) && text.size() == 6)
                        text += ":00"_L1;
                    break;
                }
                if (!text.isEmpty())
                    result.append(text);
                break;
            }

            default:
                break;
            }
        }
        if (!used)
            result.resize(result.size() + repeat, c);
        i += repeat;
    }

    return result;
}